

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

Snapshot * __thiscall cmState::Reset(Snapshot *__return_storage_ptr__,cmState *this)

{
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  PositionType pos;
  cmState *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ::clear(&(this->GlobalProperties).
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
         );
  std::
  map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
  ::clear(&this->PropertyDefinitions);
  join_0x00000010_0x00000000_ =
       cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Truncate(&this->BuildsystemDirectory);
  _local_30 = cmLinkedTree<cmState::SnapshotDataType>::Truncate(&this->SnapshotData);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"RULE_LAUNCH_COMPILE",&local_51);
  DefineProperty(this,&local_50,DIRECTORY,"","",true);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"RULE_LAUNCH_LINK",&local_89);
  DefineProperty(this,&local_88,DIRECTORY,"","",true);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"RULE_LAUNCH_CUSTOM",&local_b1);
  DefineProperty(this,&local_b0,DIRECTORY,"","",true);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"RULE_LAUNCH_COMPILE",&local_d9);
  DefineProperty(this,&local_d8,TARGET,"","",true);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"RULE_LAUNCH_LINK",&local_101);
  DefineProperty(this,&local_100,TARGET,"","",true);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"RULE_LAUNCH_CUSTOM",&local_129);
  DefineProperty(this,&local_128,TARGET,"","",true);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  Snapshot::Snapshot(__return_storage_ptr__,this,_local_30);
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot cmState::Reset()
{
  this->GlobalProperties.clear();
  this->PropertyDefinitions.clear();

  this->BuildsystemDirectory.Truncate();
  PositionType pos = this->SnapshotData.Truncate();

  this->DefineProperty
    ("RULE_LAUNCH_COMPILE", cmProperty::DIRECTORY,
     "", "", true);
  this->DefineProperty
    ("RULE_LAUNCH_LINK", cmProperty::DIRECTORY,
     "", "", true);
  this->DefineProperty
    ("RULE_LAUNCH_CUSTOM", cmProperty::DIRECTORY,
     "", "", true);

  this->DefineProperty
    ("RULE_LAUNCH_COMPILE", cmProperty::TARGET,
     "", "", true);
  this->DefineProperty
    ("RULE_LAUNCH_LINK", cmProperty::TARGET,
     "", "", true);
  this->DefineProperty
    ("RULE_LAUNCH_CUSTOM", cmProperty::TARGET,
     "", "", true);

  return Snapshot(this, pos);
}